

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphbuilderadapter.cpp
# Opt level: O1

void __thiscall
YAML::GraphBuilderAdapter::OnNull(GraphBuilderAdapter *this,Mark *mark,anchor_t anchor)

{
  _Elt_pointer pCVar1;
  void *pvVar2;
  
  pCVar1 = (this->m_containers).c.
           super__Deque_base<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pCVar1 == (this->m_containers).c.
                super__Deque_base<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    pvVar2 = (void *)0x0;
  }
  else {
    if (pCVar1 == (this->m_containers).c.
                  super__Deque_base<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pCVar1 = (this->m_containers).c.
               super__Deque_base<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    pvVar2 = pCVar1[-1].pContainer;
  }
  pvVar2 = (void *)(**(code **)(*(long *)this->m_builder + 0x10))(this->m_builder,mark,pvVar2);
  if (anchor != 0) {
    if ((ulong)((long)(this->m_anchors).m_data.super__Vector_base<void_*,_std::allocator<void_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_anchors).m_data.super__Vector_base<void_*,_std::allocator<void_*>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) < anchor) {
      std::vector<void_*,_std::allocator<void_*>_>::resize(&(this->m_anchors).m_data,anchor);
    }
    (this->m_anchors).m_data.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_start[anchor - 1] = pvVar2;
  }
  DispositionNode(this,pvVar2);
  return;
}

Assistant:

void GraphBuilderAdapter::OnNull(const Mark &mark, anchor_t anchor) {
  void *pParent = GetCurrentParent();
  void *pNode = m_builder.NewNull(mark, pParent);
  RegisterAnchor(anchor, pNode);

  DispositionNode(pNode);
}